

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

cf_size_t cf_str_count_for(cf_char_t *s,cf_char_t c)

{
  cf_char_t *local_28;
  cf_size_t cnt;
  cf_char_t *pcStack_18;
  cf_char_t c_local;
  cf_char_t *s_local;
  
  local_28 = (cf_char_t *)0x0;
  if (s == (cf_char_t *)0x0) {
    s_local = (cf_char_t *)0x0;
  }
  else {
    pcStack_18 = s;
    if (c == '\0') {
      s_local = (cf_char_t *)0x1;
    }
    else {
      for (; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
        if (*pcStack_18 == c) {
          local_28 = local_28 + 1;
        }
      }
      s_local = local_28;
    }
  }
  return (cf_size_t)s_local;
}

Assistant:

cf_size_t cf_str_count_for(cf_char_t* s, cf_char_t c) {
    cf_size_t cnt = 0;

    if (!s) return 0;
    if (c == '\0') return 1;

    while (*s != '\0') {
        if (*s == c) cnt ++;
        s++;
    }
    return cnt;
}